

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O1

SnapArrayInfoBlock<int> *
TTD::NSSnapObjects::AllocateArrayInfoBlock<int,false>
          (SlabAllocator *alloc,uint32 firstIndex,uint32 lastIndex)

{
  SnapArrayInfoBlock<int> *pSVar1;
  int *piVar2;
  uchar *puVar3;
  
  pSVar1 = (SnapArrayInfoBlock<int> *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  pSVar1->FirstIndex = firstIndex;
  pSVar1->LastIndex = lastIndex;
  piVar2 = SlabAllocatorBase<0>::SlabAllocateArray<int>(alloc,(ulong)(lastIndex - firstIndex));
  pSVar1->ArrayRangeContents = piVar2;
  puVar3 = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>
                     (alloc,(ulong)(lastIndex - firstIndex));
  pSVar1->ArrayValidTags = puVar3;
  pSVar1->Next = (SnapArrayInfoBlock<int> *)0x0;
  return pSVar1;
}

Assistant:

SnapArrayInfoBlock<T>* AllocateArrayInfoBlock(SlabAllocator& alloc, uint32 firstIndex, uint32 lastIndex)
        {
            SnapArrayInfoBlock<T>* sai = alloc.SlabAllocateStruct< SnapArrayInfoBlock<T> >();
            sai->FirstIndex = firstIndex;
            sai->LastIndex = lastIndex;

            sai->ArrayRangeContents = alloc.SlabAllocateArray<T>(lastIndex - firstIndex);
            sai->ArrayValidTags = alloc.SlabAllocateArray<byte>(lastIndex - firstIndex);

            //only zero valid flags (which guard the contents values)
            if(zeroFillValid)
            {
                memset(sai->ArrayValidTags, 0, lastIndex - firstIndex);
            }

            sai->Next = nullptr;

            return sai;
        }